

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O2

int __thiscall MarkerIndex::compare(MarkerIndex *this,MarkerId id1,MarkerId id2)

{
  int iVar1;
  Point local_30;
  Point local_28;
  
  local_28 = get_start(this,id1);
  local_30 = get_start(this,id2);
  iVar1 = Point::compare(&local_28,&local_30);
  if ((iVar1 != -1) && (iVar1 != 1)) {
    local_28 = get_end(this,id2);
    local_30 = get_end(this,id1);
    iVar1 = Point::compare(&local_28,&local_30);
  }
  return iVar1;
}

Assistant:

int MarkerIndex::compare(MarkerId id1, MarkerId id2) const {
  switch (get_start(id1).compare(get_start(id2))) {
    case -1:
      return -1;
    case 1:
      return 1;
    default:
      return get_end(id2).compare(get_end(id1));
  }
}